

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2a55c16::Parser::State::State
          (State *this,uint32_t *words_arg,size_t num_words_arg,spv_diagnostic *diagnostic_arg)

{
  this->words = words_arg;
  this->num_words = num_words_arg;
  this->diagnostic = diagnostic_arg;
  this->word_index = 0;
  this->instruction_count = 0;
  *(undefined8 *)((long)&this->instruction_count + 5) = 0;
  (this->id_to_type_id)._M_h._M_buckets = &(this->id_to_type_id)._M_h._M_single_bucket;
  (this->id_to_type_id)._M_h._M_bucket_count = 1;
  (this->id_to_type_id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_to_type_id)._M_h._M_element_count = 0;
  (this->id_to_type_id)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_to_type_id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_to_type_id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->type_id_to_number_type_info)._M_h._M_buckets =
       &(this->type_id_to_number_type_info)._M_h._M_single_bucket;
  (this->type_id_to_number_type_info)._M_h._M_bucket_count = 1;
  (this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->type_id_to_number_type_info)._M_h._M_element_count = 0;
  (this->type_id_to_number_type_info)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->type_id_to_number_type_info)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->type_id_to_number_type_info)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->import_id_to_ext_inst_type)._M_h._M_buckets =
       &(this->import_id_to_ext_inst_type)._M_h._M_single_bucket;
  (this->import_id_to_ext_inst_type)._M_h._M_bucket_count = 1;
  (this->import_id_to_ext_inst_type)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->import_id_to_ext_inst_type)._M_h._M_element_count = 0;
  (this->import_id_to_ext_inst_type)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->expected_operands).
  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->expected_operands).
  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expected_operands).
  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endian_converted_words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->endian_converted_words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->operands).super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->endian_converted_words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands).super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands).super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->import_id_to_ext_inst_type)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->import_id_to_ext_inst_type)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::reserve
            (&this->operands,0x19);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->endian_converted_words,0x19);
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::reserve
            (&this->expected_operands,0x19);
  return;
}

Assistant:

State(const uint32_t* words_arg, size_t num_words_arg,
          spv_diagnostic* diagnostic_arg)
        : words(words_arg),
          num_words(num_words_arg),
          diagnostic(diagnostic_arg),
          word_index(0),
          instruction_count(0),
          endian(),
          requires_endian_conversion(false) {
      // Temporary storage for parser state within a single instruction.
      // Most instructions require fewer than 25 words or operands.
      operands.reserve(25);
      endian_converted_words.reserve(25);
      expected_operands.reserve(25);
    }